

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase77::run(TestCase77 *this)

{
  Reader reader;
  Builder builder_00;
  Reader reader_00;
  Builder builder_01;
  Reader reader_01;
  Reader reader_02;
  Schema schema;
  undefined8 in_stack_fffffffffffffd08;
  Reader local_2b8;
  Reader local_280;
  Reader local_248;
  Schema local_218;
  Schema SStack_210;
  SegmentBuilder *local_208;
  CapTableBuilder *pCStack_200;
  void *local_1f8;
  WirePointer *pWStack_1f0;
  Reader local_1e8;
  Reader local_1b0;
  Reader local_178;
  Schema local_138;
  undefined1 auStack_130 [8];
  Builder root;
  MallocMessageBuilder builder;
  TestCase77 *this_local;
  
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)&root.builder.dataSize,0x400,GROW_HEURISTICALLY);
  schema.raw = (RawBrandedSchema *)Schema::from<capnproto_test::capnp::test::TestDefaults>();
  local_138.raw = schema.raw;
  MessageBuilder::initRoot<capnp::DynamicStruct,capnp::StructSchema>
            ((Builder *)auStack_130,(MessageBuilder *)&root.builder.dataSize,
             (StructSchema)schema.raw);
  DynamicStruct::Builder::asReader(&local_1b0,(Builder *)auStack_130);
  DynamicStruct::Reader::as<capnproto_test::capnp::test::TestDefaults>(&local_178,&local_1b0);
  reader._reader.capTable = (CapTableReader *)local_178._reader.data;
  reader._reader.segment = (SegmentReader *)local_178._reader.capTable;
  reader._reader.data = local_178._reader.pointers;
  reader._reader.pointers = (WirePointer *)local_178._reader._32_8_;
  reader._reader.dataSize = local_178._reader.nestingLimit;
  reader._reader.pointerCount = local_178._reader._44_2_;
  reader._reader._38_2_ = local_178._reader._46_2_;
  reader._reader._40_8_ = in_stack_fffffffffffffd08;
  checkTestMessage(reader);
  DynamicStruct::Builder::asReader(&local_1e8,(Builder *)auStack_130);
  reader_01.reader.segment = (SegmentReader *)local_1e8.reader.capTable;
  reader_01.schema.super_Schema.raw = (Schema)(Schema)local_1e8.reader.segment;
  reader_01.reader.capTable = (CapTableReader *)local_1e8.reader.data;
  reader_01.reader.data = local_1e8.reader.pointers;
  reader_01.reader.pointers = (WirePointer *)local_1e8.reader._32_8_;
  reader_01.reader.dataSize = local_1e8.reader.nestingLimit;
  reader_01.reader.pointerCount = local_1e8.reader._44_2_;
  reader_01.reader._38_2_ = local_1e8.reader._46_2_;
  reader_01.reader._40_8_ = schema.raw;
  checkDynamicTestMessage(reader_01);
  local_1f8 = root.builder.data;
  pWStack_1f0 = root.builder.pointers;
  local_208 = root.builder.segment;
  pCStack_200 = root.builder.capTable;
  local_218.raw = (RawBrandedSchema *)auStack_130;
  SStack_210 = root.schema.super_Schema.raw;
  builder_00.builder.segment = root.builder.segment;
  builder_00.schema = (StructSchema)(StructSchema)root.schema.super_Schema.raw;
  builder_00.builder.capTable = root.builder.capTable;
  builder_00.builder.data = root.builder.data;
  builder_00.builder.pointers = root.builder.pointers;
  builder_00.builder.dataSize = local_1e8.reader.nestingLimit;
  builder_00.builder.pointerCount = local_1e8.reader._44_2_;
  builder_00.builder._38_2_ = local_1e8.reader._46_2_;
  checkDynamicTestMessage(builder_00);
  DynamicStruct::Builder::asReader(&local_280,(Builder *)auStack_130);
  DynamicStruct::Reader::as<capnproto_test::capnp::test::TestDefaults>(&local_248,&local_280);
  reader_00._reader.capTable = (CapTableReader *)local_248._reader.data;
  reader_00._reader.segment = (SegmentReader *)local_248._reader.capTable;
  reader_00._reader.data = local_248._reader.pointers;
  reader_00._reader.pointers = (WirePointer *)local_248._reader._32_8_;
  reader_00._reader.dataSize = local_248._reader.nestingLimit;
  reader_00._reader.pointerCount = local_248._reader._44_2_;
  reader_00._reader._38_2_ = local_248._reader._46_2_;
  reader_00._reader.nestingLimit = local_1e8.reader.nestingLimit;
  reader_00._reader._44_4_ = local_1e8.reader._44_4_;
  checkTestMessage(reader_00);
  DynamicStruct::Builder::asReader(&local_2b8,(Builder *)auStack_130);
  reader_02.reader.segment = (SegmentReader *)local_2b8.reader.capTable;
  reader_02.schema.super_Schema.raw = (Schema)(Schema)local_2b8.reader.segment;
  reader_02.reader.capTable = (CapTableReader *)local_2b8.reader.data;
  reader_02.reader.data = local_2b8.reader.pointers;
  reader_02.reader.pointers = (WirePointer *)local_2b8.reader._32_8_;
  reader_02.reader.dataSize = local_2b8.reader.nestingLimit;
  reader_02.reader.pointerCount = local_2b8.reader._44_2_;
  reader_02.reader._38_2_ = local_2b8.reader._46_2_;
  reader_02.reader._40_8_ = schema.raw;
  checkDynamicTestMessage(reader_02);
  builder_01.builder.segment = root.builder.segment;
  builder_01.schema = (StructSchema)(StructSchema)root.schema.super_Schema.raw;
  builder_01.builder.capTable = root.builder.capTable;
  builder_01.builder.data = root.builder.data;
  builder_01.builder.pointers = root.builder.pointers;
  builder_01.builder.dataSize = local_2b8.reader.nestingLimit;
  builder_01.builder.pointerCount = local_2b8.reader._44_2_;
  builder_01.builder._38_2_ = local_2b8.reader._46_2_;
  checkDynamicTestMessage(builder_01);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&root.builder.dataSize);
  return;
}

Assistant:

TEST(SchemaLoader, LoadUnnamedUnion) {
  SchemaLoader loader;

  StructSchema schema =
      loader.load(Schema::from<test::TestUnnamedUnion>().getProto()).asStruct();

  EXPECT_TRUE(schema.findFieldByName("") == nullptr);

  EXPECT_TRUE(schema.findFieldByName("foo") != nullptr);
  EXPECT_TRUE(schema.findFieldByName("bar") != nullptr);
  EXPECT_TRUE(schema.findFieldByName("before") != nullptr);
  EXPECT_TRUE(schema.findFieldByName("after") != nullptr);
}